

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<CLI::Validator_*const_&,_CLI::Validator_*const_&> * __thiscall
Catch::ExprLhs<CLI::Validator*const&>::operator==
          (BinaryExpr<CLI::Validator_*const_&,_CLI::Validator_*const_&> *__return_storage_ptr__,
          ExprLhs<CLI::Validator*const&> *this,Validator **rhs)

{
  Validator **ppVVar1;
  Validator *pVVar2;
  Validator *pVVar3;
  StringRef local_40;
  
  ppVVar1 = *(Validator ***)this;
  pVVar2 = *ppVVar1;
  pVVar3 = *rhs;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = pVVar2 == pVVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00201a40;
  __return_storage_ptr__->m_lhs = ppVVar1;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }